

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

char * nk_dtoa(char *s,double n)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *in_RAX;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char *c;
  byte bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  if (s != (char *)0x0) {
    if ((n != 0.0) || (NAN(n))) {
      dVar14 = -n;
      if (-n <= n) {
        dVar14 = n;
      }
      dVar15 = -dVar14;
      if (-dVar14 <= dVar14) {
        dVar15 = dVar14;
      }
      uVar3 = 0;
      if (9 < (int)dVar15) {
        uVar3 = 0;
        uVar4 = (int)dVar15;
        do {
          uVar3 = uVar3 + 1;
          bVar2 = 99 < uVar4;
          uVar4 = uVar4 / 10;
        } while (bVar2);
      }
      uVar4 = -uVar3;
      if (0.0 <= dVar14) {
        uVar4 = uVar3;
      }
      bVar2 = (int)uVar4 < 9;
      bVar13 = 0xffffffe9 < uVar4 - 0xe;
      if (n < 0.0) {
        *s = '-';
        s = s + 1;
      }
      uVar6 = 0;
      if (bVar13 && (bVar2 || 0.0 <= n)) {
        in_RAX = (char *)0x0;
      }
      else {
        dVar15 = 1.0;
        uVar4 = ((int)uVar4 >> 0x1f) + uVar4;
        in_RAX = (char *)(ulong)uVar4;
        if (uVar4 != 0) {
          uVar3 = -uVar4;
          if (0 < (int)uVar4) {
            uVar3 = uVar4;
          }
          uVar10 = (ulong)uVar3;
          dVar15 = 1.0;
          dVar16 = 10.0;
          do {
            if ((uVar10 & 1) != 0) {
              dVar15 = dVar15 * dVar16;
            }
            uVar3 = (uint)uVar10;
            uVar10 = uVar10 >> 1;
            dVar16 = dVar16 * dVar16;
          } while (1 < uVar3);
        }
        if ((int)uVar4 < 0) {
          dVar15 = 1.0 / dVar15;
        }
        dVar14 = dVar14 / dVar15;
        uVar4 = 0;
      }
      if (0 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      do {
        iVar7 = (int)uVar6;
        dVar15 = 1.0;
        if (iVar7 != 0) {
          uVar10 = (ulong)(uint)-iVar7;
          if (0 < iVar7) {
            uVar10 = uVar6;
          }
          dVar16 = 10.0;
          dVar15 = 1.0;
          do {
            if ((uVar10 & 1) != 0) {
              dVar15 = dVar15 * dVar16;
            }
            uVar3 = (uint)uVar10;
            uVar10 = uVar10 >> 1;
            dVar16 = dVar16 * dVar16;
          } while (1 < uVar3);
        }
        if (iVar7 < 0) {
          dVar15 = 1.0 / dVar15;
        }
        if (0.0 < dVar15) {
          iVar8 = (int)(dVar14 / dVar15) - (uint)(dVar14 / dVar15 < 0.0);
          dVar14 = dVar14 - (double)iVar8 * dVar15;
          *s = (char)iVar8 + '0';
          s = s + 1;
        }
        uVar6 = (ulong)(iVar7 - 1);
        if ((iVar7 == 0) && (0.0 < dVar14)) {
          *s = '.';
          s = s + 1;
        }
      } while ((1e-14 < dVar14) || (0 < iVar7));
      if (!bVar13 || !bVar2 && 0.0 > n) {
        *s = 'e';
        if ((int)in_RAX < 1) {
          s[1] = '-';
          pcVar5 = (char *)(ulong)(uint)-(int)in_RAX;
        }
        else {
          s[1] = '+';
          pcVar5 = in_RAX;
        }
        s = s + 2;
        uVar6 = 0;
        in_RAX = pcVar5;
        if (0 < (int)pcVar5) {
          do {
            uVar3 = (uint)pcVar5;
            in_RAX = (char *)((ulong)pcVar5 / 10);
            s[uVar6] = (char)pcVar5 + (char)((ulong)pcVar5 / 10) * -10 | 0x30;
            uVar6 = uVar6 + 1;
            pcVar5 = in_RAX;
          } while (9 < uVar3);
          s = s + uVar6;
        }
        if (1 < (int)uVar6) {
          uVar6 = uVar6 & 0xffffffff;
          in_RAX = (char *)(uVar6 - 2);
          lVar9 = 0;
          lVar11 = 0;
          do {
            bVar12 = s[lVar11 - uVar6];
            bVar1 = s[lVar9 + -1];
            s[lVar11 - uVar6] = bVar12 ^ bVar1;
            bVar12 = bVar12 ^ bVar1 ^ s[lVar9 + -1];
            s[lVar9 + -1] = bVar12;
            s[lVar11 - uVar6] = s[lVar11 - uVar6] ^ bVar12;
            lVar11 = lVar11 + 1;
            pcVar5 = in_RAX + lVar9;
            lVar9 = lVar9 + -1;
          } while (lVar11 < (long)pcVar5);
        }
      }
    }
    else {
      *s = '0';
      s = s + 1;
    }
    *s = '\0';
  }
  return in_RAX;
}

Assistant:

NK_LIB char*
nk_dtoa(char *s, double n)
{
int useExp = 0;
int digit = 0, m = 0, m1 = 0;
char *c = s;
int neg = 0;

NK_ASSERT(s);
if (!s) return 0;

if (n == 0.0) {
s[0] = '0'; s[1] = '\0';
return s;
}

neg = (n < 0);
if (neg) n = -n;

/* calculate magnitude */
m = nk_log10(n);
useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
if (neg) *(c++) = '-';

/* set up for scientific notation */
if (useExp) {
if (m < 0)
m -= 1;
n = n / (double)nk_pow(10.0, m);
m1 = m;
m = 0;
}
if (m < 1.0) {
m = 0;
}

/* convert the number */
while (n > NK_FLOAT_PRECISION || m >= 0) {
double weight = nk_pow(10.0, m);
if (weight > 0) {
double t = (double)n / weight;
digit = nk_ifloord(t);
n -= ((double)digit * weight);
*(c++) = (char)('0' + (char)digit);
}
if (m == 0 && n > 0)
*(c++) = '.';
m--;
}

if (useExp) {
/* convert the exponent */
int i, j;
*(c++) = 'e';
if (m1 > 0) {
*(c++) = '+';
} else {
*(c++) = '-';
m1 = -m1;
}
m = 0;
while (m1 > 0) {
*(c++) = (char)('0' + (char)(m1 % 10));
m1 /= 10;
m++;
}
c -= m;
for (i = 0, j = m-1; i<j; i++, j--) {
/* swap without temporary */
c[i] ^= c[j];
c[j] ^= c[i];
c[i] ^= c[j];
}
c += m;
}
*(c) = '\0';
return s;
}